

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

int * __thiscall
Fossilize::StateRecorder::Impl::copy<int>(Impl *this,int *src,size_t count,ScratchAllocator *alloc)

{
  int *piVar1;
  
  if (count != 0) {
    piVar1 = ScratchAllocator::allocate_n<int>(alloc,count);
    if (piVar1 != (int *)0x0) {
      piVar1 = (int *)memmove(piVar1,src,count << 2);
      return piVar1;
    }
  }
  return (int *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}